

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

int cuddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  DdSubtable *pDVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  DdHalfWord DVar8;
  uint uVar9;
  int *piVar10;
  void *__base;
  DdNode *pDVar11;
  DdNode *moves;
  DdNode *pDVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  size_t __nmemb;
  int iVar16;
  int iVar17;
  DdHalfWord y;
  DdHalfWord DVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  DdNode *pDVar22;
  long lVar23;
  uint uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint local_44;
  
  uVar9 = table->keys;
  iVar5 = table->isolated;
  iVar16 = table->size;
  __nmemb = (size_t)iVar16;
  piVar10 = (int *)malloc(__nmemb * 4);
  entry = piVar10;
  if (piVar10 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar5 = 0;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_0079b9b5:
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
      iVar5 = 0;
      if (__base != (void *)0x0) {
        free(__base);
      }
    }
    else {
      if (0 < iVar16) {
        pDVar1 = table->subtables;
        piVar2 = table->perm;
        sVar14 = 0;
        do {
          piVar10[sVar14] = pDVar1[piVar2[sVar14]].keys;
          *(int *)((long)__base + sVar14 * 4) = (int)sVar14;
          sVar14 = sVar14 + 1;
        } while (__nmemb != sVar14);
      }
      qsort(__base,__nmemb,4,ddSymmUniqueCompare);
      auVar4 = _DAT_007ee2e0;
      auVar3 = _DAT_007ee2d0;
      uVar19 = upper - lower;
      if (lower <= upper) {
        auVar26._4_4_ = 0;
        auVar26._0_4_ = uVar19;
        auVar26._8_4_ = uVar19;
        auVar26._12_4_ = 0;
        puVar21 = &table->subtables[(long)lower + 1].next;
        uVar15 = 0;
        auVar26 = auVar26 ^ _DAT_007ee2e0;
        iVar16 = lower;
        do {
          auVar27._8_4_ = (int)uVar15;
          auVar27._0_8_ = uVar15;
          auVar27._12_4_ = (int)(uVar15 >> 0x20);
          auVar27 = (auVar27 | auVar3) ^ auVar4;
          if ((bool)(~(auVar27._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar27._0_4_ ||
                      auVar26._4_4_ < auVar27._4_4_) & 1)) {
            puVar21[-0xe] = iVar16;
          }
          if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
              auVar27._12_4_ <= auVar26._12_4_) {
            *puVar21 = iVar16 + 1;
          }
          uVar15 = uVar15 + 2;
          iVar16 = iVar16 + 2;
          puVar21 = puVar21 + 0x1c;
        } while (((ulong)uVar19 + 2 & 0xfffffffffffffffe) != uVar15);
      }
      iVar16 = table->size;
      iVar6 = table->siftMaxVar;
      iVar13 = iVar6;
      if (iVar16 < iVar6) {
        iVar13 = iVar16;
      }
      if (0 < iVar13) {
        lVar23 = 0;
        iVar13 = ddTotalNumberSwapping;
        do {
          if (table->siftMaxSwap <= iVar13) break;
          uVar19 = table->perm[*(int *)((long)__base + lVar23 * 4)];
          if (((int)uVar19 <= upper && lower <= (int)uVar19) &&
             (table->subtables[(int)uVar19].next == uVar19)) {
            iVar16 = ddSymmSiftingAux(table,uVar19,lower,upper);
            if (iVar16 == 0) goto LAB_0079b9b5;
            iVar16 = table->size;
            iVar6 = table->siftMaxVar;
            iVar13 = ddTotalNumberSwapping;
          }
          lVar23 = lVar23 + 1;
          iVar17 = iVar6;
          if (iVar16 < iVar6) {
            iVar17 = iVar16;
          }
        } while (lVar23 < iVar17);
      }
      uVar19 = table->keys - table->isolated;
      if (uVar19 < uVar9 - iVar5) {
        do {
          piVar10 = entry;
          uVar15 = 0;
          if (lower <= upper) {
            pDVar1 = table->subtables;
            piVar2 = table->invperm;
            uVar15 = 0;
            uVar9 = lower;
            do {
              do {
                uVar24 = uVar9;
                uVar9 = pDVar1[(int)uVar24].next;
              } while (uVar24 < uVar9);
              iVar5 = piVar2[(int)uVar24];
              piVar10[iVar5] = pDVar1[(int)uVar24].keys;
              *(int *)((long)__base + uVar15 * 4) = iVar5;
              uVar15 = uVar15 + 1;
              uVar9 = uVar24 + 1;
            } while ((int)uVar24 < upper);
          }
          iVar16 = (int)uVar15;
          qsort(__base,uVar15 & 0xffffffff,4,ddSymmUniqueCompare);
          iVar5 = table->siftMaxVar;
          if (iVar16 < table->siftMaxVar) {
            iVar5 = iVar16;
          }
          if (0 < iVar5) {
            lVar23 = 0;
            while( true ) {
              if (table->siftMaxSwap <= ddTotalNumberSwapping) goto LAB_0079b911;
              uVar9 = table->perm[*(int *)((long)__base + lVar23 * 4)];
              uVar24 = table->subtables[(int)uVar9].next;
              if (uVar24 <= uVar9) break;
LAB_0079b8f3:
              lVar23 = lVar23 + 1;
              iVar5 = table->siftMaxVar;
              if (iVar16 < table->siftMaxVar) {
                iVar5 = iVar16;
              }
              if (iVar5 <= lVar23) goto LAB_0079b911;
            }
            iVar5 = table->keys - table->isolated;
            if (uVar9 == lower) {
              pDVar11 = (DdNode *)ddSymmSiftingDown(table,lower,upper);
              if (pDVar11 == (DdNode *)0x0) goto LAB_0079b8f3;
              if (pDVar11 == (DdNode *)0x1) goto LAB_0079b9b5;
              y = pDVar11->ref;
              uVar9 = y;
              do {
                uVar20 = uVar9;
                uVar9 = table->subtables[(int)uVar20].next;
              } while (uVar20 < uVar9);
              if (lower - uVar24 != uVar20 - y) {
                iVar5 = table->keys - table->isolated;
LAB_0079b855:
                pDVar12 = (DdNode *)ddSymmSiftingUp(table,y,lower);
                moves = pDVar12;
                goto LAB_0079b882;
              }
              iVar5 = ddSymmSiftingBackward(table,(Move *)pDVar11,iVar5);
              moves = (DdNode *)0x0;
LAB_0079b887:
              if (iVar5 != 0) {
                if (pDVar11 != (DdNode *)0x0) {
                  pDVar12 = table->nextFree;
                  do {
                    pDVar22 = pDVar11;
                    pDVar11 = (pDVar22->type).kids.T;
                    pDVar22->ref = 0;
                    pDVar22->next = pDVar12;
                    pDVar12 = pDVar22;
                  } while (pDVar11 != (DdNode *)0x0);
                  table->nextFree = pDVar22;
                }
                if (moves != (DdNode *)0x0) {
                  pDVar11 = table->nextFree;
                  do {
                    pDVar12 = moves;
                    moves = (pDVar12->type).kids.T;
                    pDVar12->ref = 0;
                    pDVar12->next = pDVar11;
                    pDVar11 = pDVar12;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar12;
                }
                goto LAB_0079b8f3;
              }
            }
            else {
              iVar6 = cuddNextHigh(table,uVar9);
              if (upper < iVar6) {
                do {
                  uVar24 = table->subtables[(int)uVar9].next;
                  bVar25 = uVar9 < uVar24;
                  iVar6 = uVar9 - uVar24;
                  uVar9 = uVar24;
                } while (bVar25);
                if ((uVar24 == lower) ||
                   (moves = (DdNode *)ddSymmSiftingUp(table,uVar24,lower), moves == (DdNode *)0x0))
                goto LAB_0079b8f3;
                if (moves != (DdNode *)0x1) {
                  DVar18 = moves->index;
                  if (iVar6 == DVar18 - table->subtables[(int)DVar18].next) {
                    iVar5 = ddSymmSiftingBackward(table,(Move *)moves,iVar5);
                    pDVar11 = (DdNode *)0x0;
                    goto LAB_0079b887;
                  }
                  iVar5 = table->keys - table->isolated;
LAB_0079b86f:
                  pDVar12 = (DdNode *)ddSymmSiftingDown(table,DVar18,upper);
                  pDVar11 = pDVar12;
LAB_0079b882:
                  iVar5 = ddSymmSiftingBackward(table,(Move *)pDVar12,iVar5);
                  goto LAB_0079b887;
                }
                goto LAB_0079b9b5;
              }
              if ((int)(uVar9 - lower) <= (int)(upper - uVar9)) {
                local_44 = table->subtables[(int)uVar9].next;
                moves = (DdNode *)ddSymmSiftingUp(table,local_44,lower);
                if (moves == (DdNode *)0x0) {
                  uVar9 = local_44;
                  do {
                    DVar18 = uVar9;
                    uVar9 = table->subtables[(int)DVar18].next;
                  } while (DVar18 < uVar9);
                }
                else {
                  if (moves == (DdNode *)0x1) goto LAB_0079b9b5;
                  DVar18 = moves->index;
                  local_44 = table->subtables[(int)DVar18].next;
                }
                pDVar12 = (DdNode *)ddSymmSiftingDown(table,DVar18,upper);
                if (pDVar12 == (DdNode *)0x0) {
                  y = table->subtables[(int)DVar18].next;
                  DVar8 = DVar18;
                }
                else {
                  if (pDVar12 == (DdNode *)0x1) goto LAB_0079ba2d;
                  y = pDVar12->ref;
                  uVar9 = y;
                  do {
                    DVar8 = uVar9;
                    uVar9 = table->subtables[(int)DVar8].next;
                  } while (DVar8 < uVar9);
                }
                pDVar11 = pDVar12;
                if (DVar18 - local_44 != DVar8 - y) {
                  if (moves != (DdNode *)0x0) {
                    pDVar12 = table->nextFree;
                    do {
                      pDVar22 = moves;
                      moves = (pDVar22->type).kids.T;
                      pDVar22->ref = 0;
                      pDVar22->next = pDVar12;
                      pDVar12 = pDVar22;
                    } while (moves != (DdNode *)0x0);
                    table->nextFree = pDVar22;
                  }
                  iVar5 = table->keys - table->isolated;
                  goto LAB_0079b855;
                }
                goto LAB_0079b882;
              }
              pDVar11 = (DdNode *)ddSymmSiftingDown(table,uVar9,upper);
              if (pDVar11 == (DdNode *)0x0) {
                do {
                  uVar24 = uVar9;
                  uVar9 = table->subtables[(int)uVar24].next;
                } while (uVar24 < uVar9);
              }
              else {
                if (pDVar11 == (DdNode *)0x1) goto LAB_0079b9b5;
                uVar9 = pDVar11->ref;
                uVar20 = uVar9;
                do {
                  uVar24 = uVar20;
                  uVar20 = table->subtables[(int)uVar24].next;
                } while (uVar24 < uVar20);
              }
              pDVar12 = (DdNode *)ddSymmSiftingUp(table,uVar9,lower);
              if (pDVar12 == (DdNode *)0x0) {
                uVar20 = uVar9;
                do {
                  DVar18 = uVar20;
                  uVar20 = table->subtables[(int)DVar18].next;
                  uVar7 = uVar9;
                } while (DVar18 < uVar20);
LAB_0079b794:
                moves = pDVar12;
                if (uVar24 - uVar9 == DVar18 - uVar7) goto LAB_0079b882;
                if (pDVar11 != (DdNode *)0x0) {
                  pDVar12 = table->nextFree;
                  do {
                    pDVar22 = pDVar11;
                    pDVar11 = (pDVar22->type).kids.T;
                    pDVar22->ref = 0;
                    pDVar22->next = pDVar12;
                    pDVar12 = pDVar22;
                  } while (pDVar11 != (DdNode *)0x0);
                  table->nextFree = pDVar22;
                }
                iVar5 = table->keys - table->isolated;
                goto LAB_0079b86f;
              }
              if (pDVar12 != (DdNode *)0x1) {
                DVar18 = pDVar12->index;
                uVar7 = table->subtables[(int)DVar18].next;
                goto LAB_0079b794;
              }
              moves = (DdNode *)0x1;
            }
            if ((DdNode *)0x1 < pDVar11) {
              pDVar12 = table->nextFree;
              do {
                pDVar22 = pDVar11;
                pDVar11 = (pDVar22->type).kids.T;
                pDVar22->ref = 0;
                pDVar22->next = pDVar12;
                pDVar12 = pDVar22;
              } while (pDVar11 != (DdNode *)0x0);
              table->nextFree = pDVar22;
            }
LAB_0079ba2d:
            if ((DdNode *)0x1 < moves) {
              pDVar11 = table->nextFree;
              do {
                pDVar12 = moves;
                moves = (pDVar12->type).kids.T;
                pDVar12->ref = 0;
                pDVar12->next = pDVar11;
                pDVar11 = pDVar12;
              } while (moves != (DdNode *)0x0);
              table->nextFree = pDVar12;
            }
            goto LAB_0079b9b5;
          }
LAB_0079b911:
          uVar9 = table->keys - table->isolated;
          bVar25 = uVar9 < uVar19;
          uVar19 = uVar9;
        } while (bVar25);
      }
      iVar5 = 1;
      if (lower <= upper) {
        iVar5 = 0;
        do {
          uVar9 = table->subtables[lower].next;
          uVar24 = lower;
          uVar19 = lower;
          while (uVar20 = uVar24, uVar9 != lower) {
            iVar5 = iVar5 + 1;
            uVar9 = table->subtables[(int)uVar20].next;
            uVar24 = uVar9;
            uVar19 = uVar20;
          }
          lower = uVar19 + 1;
        } while ((int)uVar19 < upper);
        iVar5 = iVar5 + 1;
      }
      free(__base);
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
    }
  }
  return iVar5;
}

Assistant:

int
cuddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         initialSize;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keys - table->isolated;

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar, table->size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtables[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keys - table->isolated;
#endif
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keys - table->isolated) {
        initialSize = table->keys - table->isolated;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtables[x].next) {
                x = table->subtables[x].next;
            }
            /* Here x is the largest index in a group.
            ** Groups consist of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invperm[x];
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

        /* Now sift. */
        for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
            if (ddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->perm[var[i]];
            if ((unsigned) x >= table->subtables[x].next) {
#ifdef DD_STATS
                previousSize = table->keys - table->isolated;
#endif
                result = ddSymmSiftingConvAux(table,x,lower,upper);
                if (!result ) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keys < (unsigned) previousSize + table->isolated) {
                    (void) fprintf(table->out,"-");
                } else if (table->keys > (unsigned) previousSize +
                           table->isolated) {
                    (void) fprintf(table->out,"+");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1+symvars);

ddSymmSiftingConvOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}